

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

void __thiscall MidiInApi::~MidiInApi(MidiInApi *this)

{
  MidiMessage *pMVar1;
  double dVar2;
  void *pvVar3;
  pointer puVar4;
  pointer pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long lVar7;
  
  (this->super_MidiApi)._vptr_MidiApi = (_func_int **)&PTR__MidiInApi_00115af0;
  if (((this->inputData_).queue.ringSize != 0) &&
     (pMVar1 = (this->inputData_).queue.ring, pMVar1 != (MidiMessage *)0x0)) {
    dVar2 = pMVar1[-1].timeStamp;
    if (dVar2 != 0.0) {
      lVar7 = (long)dVar2 << 5;
      do {
        pvVar3 = *(void **)((long)&pMVar1[-1].bytes.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar7);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)pMVar1 + lVar7 + -0x10) - (long)pvVar3);
        }
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != 0);
    }
    operator_delete__(&pMVar1[-1].timeStamp,(long)dVar2 << 5 | 8);
  }
  puVar4 = (this->inputData_).message.bytes.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->inputData_).message.bytes.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  (this->super_MidiApi)._vptr_MidiApi = (_func_int **)&PTR__MidiOutApi_00115a88;
  pcVar5 = (this->super_MidiApi).errorString_._M_dataplus._M_p;
  paVar6 = &(this->super_MidiApi).errorString_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar6) {
    operator_delete(pcVar5,paVar6->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

MidiInApi :: ~MidiInApi( void )
{
  // Delete the MIDI queue.
  if ( inputData_.queue.ringSize > 0 ) delete [] inputData_.queue.ring;
}